

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::GetDocumentation
          (cmExtraCodeBlocksGenerator *this,cmDocumentationEntry *entry,string *param_2)

{
  string local_30 [32];
  
  (*(this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator[2])
            (local_30,this);
  std::__cxx11::string::operator=((string *)entry,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::assign((char *)&entry->Brief);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator
::GetDocumentation(cmDocumentationEntry& entry, const std::string&) const
{
  entry.Name = this->GetName();
  entry.Brief = "Generates CodeBlocks project files.";
}